

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wrestler.cpp
# Opt level: O1

void __thiscall fp_remover::classes::Wrestler::Wrestler(Wrestler *this,string *name)

{
  pointer pcVar1;
  string local_38;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + name->_M_string_length);
  Character::Character(&this->super_Character,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->first_name)._M_dataplus._M_p = (pointer)&(this->first_name).field_2;
  (this->first_name)._M_string_length = 0;
  (this->first_name).field_2._M_local_buf[0] = '\0';
  (this->last_name)._M_dataplus._M_p = (pointer)&(this->last_name).field_2;
  (this->last_name)._M_string_length = 0;
  (this->last_name).field_2._M_local_buf[0] = '\0';
  (this->nickname)._M_dataplus._M_p = (pointer)&(this->nickname).field_2;
  (this->nickname)._M_string_length = 0;
  (this->nickname).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Wrestler::Wrestler(string name) : Character(name)
{

}